

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O1

void __thiscall sznet::net::Buffer::makeSpace(Buffer *this,size_t len)

{
  ulong uVar1;
  pointer pcVar2;
  size_t sVar3;
  ulong uVar4;
  
  uVar1 = this->m_nCheapPrepend;
  pcVar2 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar3 = this->m_writerIndex;
  uVar4 = this->m_readerIndex;
  if ((this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish + uVar4 + (-(long)pcVar2 - sVar3) < (pointer)(uVar1 + len))
  {
    std::vector<char,_std::allocator<char>_>::resize(&this->m_buffer,sVar3 + len);
    this->m_wrapSize =
         (ulong)(((long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                 (long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start) * 3) >> 2;
  }
  else {
    if (uVar4 <= uVar1) {
      __assert_fail("m_nCheapPrepend < m_readerIndex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Buffer.h"
                    ,0x18e,"void sznet::net::Buffer::makeSpace(size_t)");
    }
    memmove(pcVar2 + uVar1,pcVar2 + uVar4,sVar3 - uVar4);
    this->m_readerIndex = this->m_nCheapPrepend;
    this->m_writerIndex = (sVar3 - uVar4) + this->m_nCheapPrepend;
  }
  return;
}

Assistant:

void makeSpace(size_t len)
	{
		if (writableBytes() + prependableBytes() < len + m_nCheapPrepend)
		{
			// ������ȷʵ������
			// FIXME: move readable data
			m_buffer.resize(m_writerIndex + len);
			m_wrapSize = m_buffer.capacity() * 3 / 4;
		}
		else
		{
			// ����
			assert(m_nCheapPrepend < m_readerIndex);
			wrapBuffer();
		}
	}